

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory_mapper_posix.cpp
# Opt level: O1

void __thiscall
pstore::memory_mapper::memory_mapper
          (memory_mapper *this,file_handle *file,bool write_enabled,uint64_t offset,uint64_t length)

{
  undefined3 in_register_00000011;
  __off_t in_R9;
  element_type *local_38;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_30;
  
  mmap(&local_38,(size_t)file,CONCAT31(in_register_00000011,write_enabled),(int)offset,(int)length,
       in_R9);
  (this->super_memory_mapper_base)._vptr_memory_mapper_base =
       (_func_int **)&PTR___cxa_pure_virtual_00199a78;
  (this->super_memory_mapper_base).ptr_.super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = local_38;
  (this->super_memory_mapper_base).ptr_.super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->super_memory_mapper_base).ptr_.super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = local_30;
  (this->super_memory_mapper_base).is_writable_ = write_enabled;
  (this->super_memory_mapper_base).offset_ = offset;
  (this->super_memory_mapper_base).size_ = length;
  (this->super_memory_mapper_base)._vptr_memory_mapper_base =
       (_func_int **)&PTR__memory_mapper_00199b68;
  return;
}

Assistant:

memory_mapper::memory_mapper (file::file_handle & file, bool const write_enabled,
                                  std::uint64_t const offset, std::uint64_t const length)
            : memory_mapper_base (mmap (file, write_enabled, offset, length), write_enabled, offset,
                                  length) {}